

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

uint QtPrivate::QMetaTypeForType<QString>::flags(void)

{
  return 0xc007;
}

Assistant:

static constexpr unsigned flags()
    {
        uint flags = 0;
        if constexpr (QTypeInfo<S>::isRelocatable)
            flags |= QMetaType::RelocatableType;
        if constexpr (!std::is_default_constructible_v<S> || !QTypeInfo<S>::isValueInitializationBitwiseZero)
            flags |= QMetaType::NeedsConstruction;
        if constexpr (!std::is_trivially_destructible_v<S>)
            flags |= QMetaType::NeedsDestruction;
        if constexpr (!std::is_trivially_copy_constructible_v<S>)
            flags |= QMetaType::NeedsCopyConstruction;
        if constexpr (!std::is_trivially_move_constructible_v<S>)
            flags |= QMetaType::NeedsMoveConstruction;
        if constexpr (IsPointerToTypeDerivedFromQObject<S>::Value)
            flags |= QMetaType::PointerToQObject;
        if constexpr (IsSharedPointerToTypeDerivedFromQObject<S>::Value)
            flags |= QMetaType::SharedPointerToQObject;
        if constexpr (IsWeakPointerToTypeDerivedFromQObject<S>::Value)
            flags |= QMetaType::WeakPointerToQObject;
        if constexpr (IsTrackingPointerToTypeDerivedFromQObject<S>::Value)
            flags |= QMetaType::TrackingPointerToQObject;
        if constexpr (IsEnumOrFlags<S>::value)
            flags |= QMetaType::IsEnumeration;
        if constexpr (IsGadgetHelper<S>::IsGadgetOrDerivedFrom)
            flags |= QMetaType::IsGadget;
        if constexpr (IsPointerToGadgetHelper<S>::IsGadgetOrDerivedFrom)
            flags |= QMetaType::PointerToGadget;
        if constexpr (std::is_pointer_v<S>)
            flags |= QMetaType::IsPointer;
        if constexpr (IsUnsignedEnum<S>)
            flags |= QMetaType::IsUnsignedEnumeration;
        if constexpr (IsQmlListType<S>)
            flags |= QMetaType::IsQmlList;
        if constexpr (std::is_const_v<std::remove_pointer_t<S>>)
            flags |= QMetaType::IsConst;
        return flags;
    }